

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_monitor.c
# Opt level: O3

void outputHandleScale(void *userData,wl_output *output,int32_t factor)

{
  _GLFWwindow *window;
  size_t sVar1;
  int32_t *piVar2;
  
  *(int32_t *)((long)userData + 0x118) = factor;
  window = _glfw.windowListHead;
  do {
    if (window == (_GLFWwindow *)0x0) {
      return;
    }
    sVar1 = (window->wl).outputScaleCount;
    if (sVar1 != 0) {
      piVar2 = &((window->wl).outputScales)->factor;
      do {
        if (((_GLFWscaleWayland *)(piVar2 + -2))->output == *(wl_output **)((long)userData + 0x100))
        {
          *piVar2 = *(int32_t *)((long)userData + 0x118);
          _glfwUpdateBufferScaleFromOutputsWayland(window);
          break;
        }
        piVar2 = piVar2 + 4;
        sVar1 = sVar1 - 1;
      } while (sVar1 != 0);
    }
    window = window->next;
  } while( true );
}

Assistant:

static void outputHandleScale(void* userData,
                              struct wl_output* output,
                              int32_t factor)
{
    struct _GLFWmonitor* monitor = userData;

    monitor->wl.scale = factor;

    for (_GLFWwindow* window = _glfw.windowListHead; window; window = window->next)
    {
        for (size_t i = 0; i < window->wl.outputScaleCount; i++)
        {
            if (window->wl.outputScales[i].output == monitor->wl.output)
            {
                window->wl.outputScales[i].factor = monitor->wl.scale;
                _glfwUpdateBufferScaleFromOutputsWayland(window);
                break;
            }
        }
    }
}